

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyParseFrameSet(TidyDocImpl *doc,Node *frameset,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  Node *local_30;
  Node *node;
  Lexer *lexer;
  GetTokenMode mode_local;
  Node *frameset_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((doc->config).value[1].v == 0) {
    doc->badAccess = doc->badAccess | 0x10;
  }
  while( true ) {
    local_30 = prvTidyGetToken(doc,IgnoreWhitespace);
    if (local_30 == (Node *)0x0) {
      prvTidyReport(doc,frameset,(Node *)0x0,0x25a);
      return;
    }
    if ((local_30->tag == frameset->tag) && (local_30->type == EndTag)) break;
    BVar2 = InsertMisc(frameset,local_30);
    if (BVar2 == no) {
      if (local_30->tag == (Dict *)0x0) {
        prvTidyReport(doc,frameset,local_30,0x235);
        prvTidyFreeNode(doc,local_30);
      }
      else {
        BVar2 = prvTidynodeIsElement(local_30);
        if (((BVar2 == no) || (local_30->tag == (Dict *)0x0)) || ((local_30->tag->model & 4) == 0))
        {
          if (((local_30 != (Node *)0x0) && (local_30->tag != (Dict *)0x0)) &&
             (local_30->tag->id == TidyTag_BODY)) {
            prvTidyUngetToken(doc);
            local_30 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
            prvTidyReport(doc,frameset,local_30,0x247);
          }
          if ((local_30->type == StartTag) && ((local_30->tag->model & 0x2000) != 0)) {
            prvTidyInsertNodeAtEnd(frameset,local_30);
            pLVar1->excludeBlocks = no;
            ParseTag(doc,local_30,MixedContent);
          }
          else if ((local_30->type == StartEndTag) && ((local_30->tag->model & 0x2000) != 0)) {
            prvTidyInsertNodeAtEnd(frameset,local_30);
          }
          else {
            if (((local_30 != (Node *)0x0) && (local_30->tag != (Dict *)0x0)) &&
               (local_30->tag->id == TidyTag_A)) {
              doc->badAccess = doc->badAccess | 0x40;
            }
            prvTidyReport(doc,frameset,local_30,0x235);
            prvTidyFreeNode(doc,local_30);
          }
        }
        else {
          MoveToHead(doc,frameset,local_30);
        }
      }
    }
  }
  prvTidyFreeNode(doc,local_30);
  frameset->closed = yes;
  TrimSpaces(doc,frameset);
  return;
}

Assistant:

void TY_(ParseFrameSet)(TidyDocImpl* doc, Node *frameset, GetTokenMode ARG_UNUSED(mode))
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
    {
        doc->badAccess |= BA_USING_FRAMES;
    }
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == frameset->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            frameset->closed = yes;
            TrimSpaces(doc, frameset);
            return;
        }

        /* deal with comments etc. */
        if (InsertMisc(frameset, node))
            continue;

        if (node->tag == NULL)
        {
            TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue; 
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, frameset, node);
                continue;
            }
        }

        if ( nodeIsBODY(node) )
        {
            TY_(UngetToken)( doc );
            node = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
            TY_(Report)(doc, frameset, node, INSERTING_TAG);
        }

        if (node->type == StartTag && (node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            lexer->excludeBlocks = no;
            ParseTag(doc, node, MixedContent);
            continue;
        }
        else if (node->type == StartEndTag && (node->tag->model & CM_FRAMES))
        {
            TY_(InsertNodeAtEnd)(frameset, node);
            continue;
        }

        /* discard unexpected tags */
        /* WAI [6.5.1.4] link is being discarded outside of NOFRAME */
        if ( nodeIsA(node) )
           doc->badAccess |= BA_INVALID_LINK_NOFRAMES;

        TY_(Report)(doc, frameset, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, frameset, node, MISSING_ENDTAG_FOR);
}